

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_rea.c
# Opt level: O0

size_t tool_read_cb(char *buffer,size_t sz,size_t nmemb,void *userdata)

{
  long lVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  timeval newer;
  curl_off_t delta;
  fd_set *__arr;
  uint __i;
  long wait;
  timeval timeout;
  fd_set bits;
  long msdelta;
  timeval now;
  OperationConfig *config;
  per_transfer *per;
  ssize_t rc;
  void *userdata_local;
  size_t nmemb_local;
  size_t sz_local;
  char *buffer_local;
  
  lVar1 = *(long *)((long)userdata + 0x10);
  if ((*(long *)((long)userdata + 0x1b0) != -1) &&
     (*(long *)((long)userdata + 0x1b8) == *(long *)((long)userdata + 0x1b0))) {
    return 0;
  }
  if (*(long *)(lVar1 + 0xb8) != 0) {
    newer = tvnow();
    lVar3 = tvdiff(newer,*(timeval *)((long)userdata + 0x48));
    if (*(long *)(lVar1 + 0xb8) < lVar3) {
      return 0;
    }
    lVar3 = *(long *)(lVar1 + 0xb8) - lVar3;
    wait = lVar3 / 1000;
    timeout.tv_sec = (__time_t)((int)(lVar3 % 1000) * 1000);
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      bits.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
    }
    lVar3 = (long)(*(int *)((long)userdata + 0x80) / 0x40);
    bits.fds_bits[lVar3 + -1] =
         1L << ((byte)((long)*(int *)((long)userdata + 0x80) % 0x40) & 0x3f) |
         bits.fds_bits[lVar3 + -1];
    iVar2 = select(*(int *)((long)userdata + 0x80) + 1,(fd_set *)&timeout.tv_usec,(fd_set *)0x0,
                   (fd_set *)0x0,(timeval *)&wait);
    if (iVar2 == 0) {
      return 0;
    }
  }
  per = (per_transfer *)read(*(int *)((long)userdata + 0x80),buffer,sz * nmemb);
  if ((long)per < 0) {
    piVar4 = __errno_location();
    if (*piVar4 == 0xb) {
      piVar4 = __errno_location();
      *piVar4 = 0;
      *(undefined1 *)(lVar1 + 0x342) = 1;
      return 0x10000001;
    }
    per = (per_transfer *)0x0;
  }
  if ((*(long *)((long)userdata + 0x1b0) != -1) &&
     (*(long *)((long)userdata + 0x1b0) < (long)&per->next + *(long *)((long)userdata + 0x1b8))) {
    warnf(*(GlobalConfig **)(*(long *)((long)userdata + 0x10) + 0x528),
          "File size larger in the end than when started. Dropping at least %ld bytes",
          (long)per + (*(long *)((long)userdata + 0x1b8) - *(long *)((long)userdata + 0x1b0)));
    per = (per_transfer *)(*(long *)((long)userdata + 0x1b0) - *(long *)((long)userdata + 0x1b8));
  }
  *(undefined1 *)(lVar1 + 0x342) = 0;
  return (size_t)per;
}

Assistant:

size_t tool_read_cb(char *buffer, size_t sz, size_t nmemb, void *userdata)
{
  ssize_t rc = 0;
  struct per_transfer *per = userdata;
  struct OperationConfig *config = per->config;

  if((per->uploadfilesize != -1) &&
     (per->uploadedsofar == per->uploadfilesize)) {
    /* done */
    return 0;
  }

  if(config->timeout_ms) {
    struct timeval now = tvnow();
    long msdelta = tvdiff(now, per->start);

    if(msdelta > config->timeout_ms)
      /* timeout */
      return 0;
#ifndef _WIN32
    /* this logic waits on read activity on a file descriptor that is not a
       socket which makes it not work with select() on Windows */
    else {
      fd_set bits;
      struct timeval timeout;
      long wait = config->timeout_ms - msdelta;

      /* wait this long at the most */
      timeout.tv_sec = wait/1000;
      timeout.tv_usec = (int)((wait%1000)*1000);

      FD_ZERO(&bits);
      FD_SET(per->infd, &bits);
      if(!select(per->infd + 1, &bits, NULL, NULL, &timeout))
        return 0; /* timeout */
    }
#endif
  }

  rc = read(per->infd, buffer, sz*nmemb);
  if(rc < 0) {
    if(errno == EAGAIN) {
      errno = 0;
      config->readbusy = TRUE;
      return CURL_READFUNC_PAUSE;
    }
    /* since size_t is unsigned we cannot return negative values fine */
    rc = 0;
  }
  if((per->uploadfilesize != -1) &&
     (per->uploadedsofar + rc > per->uploadfilesize)) {
    /* do not allow uploading more than originally set out to do */
    curl_off_t delta = per->uploadedsofar + rc - per->uploadfilesize;
    warnf(per->config->global, "File size larger in the end than when "
          "started. Dropping at least %" CURL_FORMAT_CURL_OFF_T " bytes",
          delta);
    rc = (ssize_t)(per->uploadfilesize - per->uploadedsofar);
  }
  config->readbusy = FALSE;

  /* when select() returned zero here, it timed out */
  return (size_t)rc;
}